

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O2

void __thiscall
QNetworkAccessBackendFactory::QNetworkAccessBackendFactory(QNetworkAccessBackendFactory *this)

{
  Type *pTVar1;
  QNetworkAccessBackendFactory *this_00;
  
  this_00 = this;
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002c9368;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>
                       *)this_00);
  if (pTVar1 != (Type *)0x0) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::
             instance();
    QList<QNetworkAccessBackendFactory_*>::append
              (&pTVar1->super_QList<QNetworkAccessBackendFactory_*>,(parameter_type)this);
    return;
  }
  return;
}

Assistant:

QNetworkAccessBackendFactory::QNetworkAccessBackendFactory()
{
    if (factoryData())
        factoryData->append(this);
}